

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::Reflection::InternalSwap(Reflection *this,Message *lhs,Message *rhs)

{
  ReflectionSchema *pRVar1;
  intptr_t iVar2;
  void *pvVar3;
  Message *pMVar4;
  bool bVar5;
  int i_2;
  CppStringType CVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  FieldDescriptor *pFVar9;
  OneofDescriptor *pOVar10;
  void **ppvVar11;
  void **ppvVar12;
  uint32_t *puVar13;
  uint32_t *puVar14;
  ulong uVar15;
  Nullable<const_char_*> failure_msg;
  ulong uVar16;
  int i_1;
  int iVar17;
  int i;
  int iVar18;
  int i_3;
  uint uVar19;
  bool local_55;
  int local_54;
  Message *local_50;
  ReflectionSchema *local_48;
  LogMessageFatal local_40;
  
  if (lhs != rhs) {
    iVar2 = (lhs->super_MessageLite)._internal_metadata_.ptr_;
    (lhs->super_MessageLite)._internal_metadata_.ptr_ =
         (rhs->super_MessageLite)._internal_metadata_.ptr_;
    (rhs->super_MessageLite)._internal_metadata_.ptr_ = iVar2;
    pRVar1 = &this->schema_;
    for (iVar18 = 0; iVar18 <= this->last_non_weak_field_index_; iVar18 = iVar18 + 1) {
      pFVar9 = Descriptor::field(this->descriptor_,iVar18);
      pOVar10 = FieldDescriptor::real_containing_oneof(pFVar9);
      if (pOVar10 == (OneofDescriptor *)0x0) {
        bVar5 = internal::ReflectionSchema::IsSplit(pRVar1,pFVar9);
        if (!bVar5) {
          UnsafeShallowSwapField(this,lhs,rhs,pFVar9);
        }
      }
    }
    if ((this->schema_).split_offset_ != -1) {
      ppvVar11 = MutableSplitField(this,lhs);
      ppvVar12 = MutableSplitField(this,rhs);
      pvVar3 = *ppvVar11;
      *ppvVar11 = *ppvVar12;
      *ppvVar12 = pvVar3;
    }
    iVar18 = this->descriptor_->real_oneof_decl_count_;
    iVar17 = 0;
    if (iVar18 < 1) {
      iVar18 = 0;
      iVar17 = 0;
    }
    for (; iVar18 != iVar17; iVar17 = iVar17 + 1) {
      pOVar10 = Descriptor::real_oneof_decl(this->descriptor_,iVar17);
      SwapOneofField<true>(this,lhs,rhs,pOVar10);
    }
    local_50 = rhs;
    local_48 = pRVar1;
    if ((this->schema_).has_bits_offset_ != -1) {
      puVar13 = MutableHasBits(this,lhs);
      puVar14 = MutableHasBits(this,local_50);
      iVar17 = 0;
      for (iVar18 = 0; iVar18 < this->descriptor_->field_count_; iVar18 = iVar18 + 1) {
        pFVar9 = Descriptor::field(this->descriptor_,iVar18);
        bVar5 = internal::cpp::HasHasbit(pFVar9);
        iVar17 = iVar17 + (uint)bVar5;
      }
      for (uVar15 = 0; iVar17 + 0x1fU >> 5 != uVar15; uVar15 = uVar15 + 1) {
        uVar7 = puVar13[uVar15];
        puVar13[uVar15] = puVar14[uVar15];
        puVar14[uVar15] = uVar7;
      }
    }
    if ((this->schema_).inlined_string_donated_offset_ != -1) {
      puVar13 = MutableInlinedStringDonatedArray(this,lhs);
      puVar14 = MutableInlinedStringDonatedArray(this,local_50);
      local_54 = 0;
      for (iVar18 = 0; iVar18 < this->descriptor_->field_count_; iVar18 = iVar18 + 1) {
        pFVar9 = Descriptor::field(this->descriptor_,iVar18);
        if ((*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)pFVar9->type_ * 4) == 9) &&
           ((pFVar9->field_0x1 & 8) == 0)) {
          bVar5 = FieldDescriptor::is_repeated(pFVar9);
          if (!bVar5) {
            pOVar10 = FieldDescriptor::real_containing_oneof(pFVar9);
            if (pOVar10 == (OneofDescriptor *)0x0) {
              CVar6 = FieldDescriptor::cpp_string_type(pFVar9);
              if (CVar6 == kString) {
                bVar5 = internal::ReflectionSchema::IsFieldInlined(local_48,pFVar9);
                local_54 = local_54 + (uint)bVar5;
              }
            }
          }
        }
      }
      if (local_54 == 0) {
        uVar19 = 0;
      }
      else {
        uVar19 = (local_54 + 0x20) / 0x20;
      }
      local_40.super_LogMessage.errno_saver_.saved_errno_._0_1_ = ~(byte)*puVar13 & 1;
      local_55 = (bool)(~(byte)*puVar14 & 1);
      failure_msg = absl::lts_20250127::log_internal::Check_EQImpl<bool,bool>
                              ((bool *)&local_40,&local_55,
                               "(lhs_donated_array[0] & 0x1u) == 0 == (rhs_donated_array[0] & 0x1u) == 0"
                              );
      if (failure_msg != (Nullable<const_char_*>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                   ,0x541,failure_msg);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
      }
      uVar16 = 0;
      uVar15 = (ulong)uVar19;
      if ((int)uVar19 < 1) {
        uVar15 = uVar16;
      }
      for (; uVar15 != uVar16; uVar16 = uVar16 + 1) {
        uVar7 = puVar13[uVar16];
        puVar13[uVar16] = puVar14[uVar16];
        puVar14[uVar16] = uVar7;
      }
    }
    pRVar1 = local_48;
    pMVar4 = local_50;
    if ((this->schema_).extensions_offset_ != -1) {
      uVar7 = internal::ReflectionSchema::GetExtensionSetOffset(local_48);
      uVar8 = internal::ReflectionSchema::GetExtensionSetOffset(pRVar1);
      internal::ExtensionSet::InternalSwap
                ((ExtensionSet *)((long)&(lhs->super_MessageLite)._vptr_MessageLite + (ulong)uVar7),
                 (ExtensionSet *)
                 ((long)&(pMVar4->super_MessageLite)._vptr_MessageLite + (ulong)uVar8));
    }
  }
  return;
}

Assistant:

void Reflection::InternalSwap(Message* lhs, Message* rhs) const {
  if (lhs == rhs) return;

  MutableInternalMetadata(lhs)->InternalSwap(MutableInternalMetadata(rhs));

  for (int i = 0; i <= last_non_weak_field_index_; i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (schema_.InRealOneof(field)) continue;
    if (schema_.IsSplit(field)) {
      continue;
    }
    UnsafeShallowSwapField(lhs, rhs, field);
  }
  if (schema_.IsSplit()) {
    std::swap(*MutableSplitField(lhs), *MutableSplitField(rhs));
  }
  const int oneof_decl_count = descriptor_->real_oneof_decl_count();
  for (int i = 0; i < oneof_decl_count; i++) {
    const OneofDescriptor* oneof = descriptor_->real_oneof_decl(i);
    SwapOneofField<true>(lhs, rhs, oneof);
  }

  // Swapping bits need to happen after swapping fields, because the latter may
  // depend on the has bit information.
  if (schema_.HasHasbits()) {
    uint32_t* lhs_has_bits = MutableHasBits(lhs);
    uint32_t* rhs_has_bits = MutableHasBits(rhs);

    int fields_with_has_bits = 0;
    for (int i = 0; i < descriptor_->field_count(); i++) {
      const FieldDescriptor* field = descriptor_->field(i);
      if (internal::cpp::HasHasbit(field)) {
        ++fields_with_has_bits;
      }
    }

    int has_bits_size = (fields_with_has_bits + 31) / 32;

    for (int i = 0; i < has_bits_size; i++) {
      std::swap(lhs_has_bits[i], rhs_has_bits[i]);
    }
  }

  if (schema_.HasInlinedString()) {
    uint32_t* lhs_donated_array = MutableInlinedStringDonatedArray(lhs);
    uint32_t* rhs_donated_array = MutableInlinedStringDonatedArray(rhs);
    int inlined_string_count = 0;
    for (int i = 0; i < descriptor_->field_count(); i++) {
      const FieldDescriptor* field = descriptor_->field(i);
      if (field->cpp_type() != FieldDescriptor::CPPTYPE_STRING) continue;
      if (field->is_extension() || field->is_repeated() ||
          schema_.InRealOneof(field) ||
          field->cpp_string_type() != FieldDescriptor::CppStringType::kString ||
          !IsInlined(field)) {
        continue;
      }
      inlined_string_count++;
    }

    int donated_array_size = inlined_string_count == 0
                                 ? 0
                                 // One extra bit for the arena dtor tracking.
                                 : (inlined_string_count + 1 + 31) / 32;
    ABSL_CHECK_EQ((lhs_donated_array[0] & 0x1u) == 0,
                  (rhs_donated_array[0] & 0x1u) == 0);
    for (int i = 0; i < donated_array_size; i++) {
      std::swap(lhs_donated_array[i], rhs_donated_array[i]);
    }
  }

  if (schema_.HasExtensionSet()) {
    MutableExtensionSet(lhs)->InternalSwap(MutableExtensionSet(rhs));
  }
}